

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O1

int fe_end_utt(fe_t *fe,mfcc_t *cepvector,int32 *nframes)

{
  int32 len;
  
  len = fe->num_overflow_samps;
  if (0 < len) {
    fe_read_frame_int16(fe,fe->overflow_samps,len);
    fe_write_frame(fe,cepvector);
  }
  *nframes = (uint)(0 < len);
  fe->num_overflow_samps = 0;
  return 0;
}

Assistant:

int32
fe_end_utt(fe_t * fe, mfcc_t * cepvector, int32 * nframes)
{
    /* Process any remaining data. */
    if (fe->num_overflow_samps > 0) {
        fe_read_frame_int16(fe, fe->overflow_samps,
                            fe->num_overflow_samps);
        fe_write_frame(fe, cepvector);
        *nframes = 1;
    }
    else {
        *nframes = 0;
    }

    /* reset overflow buffers... */
    fe->num_overflow_samps = 0;

    return 0;
}